

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

StackSym * __thiscall GlobOptBlockData::GetCopyPropSym(GlobOptBlockData *this,Sym *sym,Value *value)

{
  ValueInfo *this_00;
  StackSym *sym_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  StackSym *sym_01;
  
  this_00 = value->valueInfo;
  sym_00 = (StackSym *)this_00->symStore;
  if (sym_00 != (StackSym *)0x0) {
    if (sym_00 == (StackSym *)sym) {
      return (StackSym *)0x0;
    }
    if ((sym_00->super_Sym).m_kind != SymKindStack) {
      return (StackSym *)0x0;
    }
    sym_01 = sym_00;
    if ((sym_00->field_0x1a & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x5bf,"(!copySym->AsStackSym()->IsTypeSpec())",
                         "!copySym->AsStackSym()->IsTypeSpec()");
      if (!bVar2) goto LAB_00493b38;
      *puVar3 = 0;
      sym_01 = (StackSym *)this_00->symStore;
    }
    pVVar4 = FindValue(this,&sym_01->super_Sym);
    if (((pVVar4 != (Value *)0x0) && (pVVar4->valueNumber == value->valueNumber)) &&
       ((bVar2 = ValueInfo::IsVarConstant(this_00), !bVar2 ||
        (bVar2 = IsLive(this,(Sym *)sym_00), bVar2)))) {
      if ((sym_00->super_Sym).m_kind == SymKindStack) {
        return sym_00;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (bVar2) {
        *puVar3 = 0;
        return sym_00;
      }
LAB_00493b38:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym *
GlobOptBlockData::GetCopyPropSym(Sym * sym, Value * value)
{
    ValueInfo *valueInfo = value->GetValueInfo();
    Sym * copySym = valueInfo->GetSymStore();

    if (!copySym)
    {
        return nullptr;
    }

    // Only copy prop stackSym, as a propertySym wouldn't improve anything.
    // SingleDef info isn't flow sensitive, so make sure the symbol is actually live.
    if (copySym->IsStackSym() && copySym != sym)
    {
        Assert(!copySym->AsStackSym()->IsTypeSpec());
        Value *copySymVal = this->FindValue(valueInfo->GetSymStore());
        if (copySymVal && copySymVal->GetValueNumber() == value->GetValueNumber())
        {
            if (valueInfo->IsVarConstant() && !this->IsLive(copySym))
            {
                // Because the addrConstantToValueMap isn't flow-based, the symStore of
                // varConstants may not be live.
                return nullptr;
            }
            return copySym->AsStackSym();
        }
    }
    return nullptr;
}